

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O3

void __thiscall CVmImageLoader::load_static_objs(CVmImageLoader *this,ulong siz)

{
  ulong uVar1;
  uint uVar2;
  uint idx;
  uint id;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  uint uVar5;
  ulong siz_00;
  ulong uVar6;
  ulong uVar7;
  char buf [32];
  uint local_58;
  uint local_54;
  
  if (5 < siz) {
    (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_58,6);
    uVar3 = local_54;
    uVar5 = local_58 & 0xffff;
    if ((short)local_58 != 0) {
      idx = local_58 >> 0x10;
      uVar1 = (ulong)(local_54 & 1) * 2 + 6;
      uVar7 = siz - 6;
      do {
        uVar6 = uVar7 - uVar1;
        if (uVar7 < uVar1) goto LAB_00262bfb;
        (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_58);
        id = local_58;
        uVar2 = local_54 & 0xffff;
        if ((uVar3 & 1) != 0) {
          uVar2 = local_54;
        }
        siz_00 = (ulong)uVar2;
        uVar7 = uVar6 - siz_00;
        if (uVar6 < siz_00) goto LAB_00262bfb;
        iVar4 = (*this->fp_->_vptr_CVmImageFile[4])(this->fp_,siz_00,0,uVar6);
        CVmMetaTable::create_from_image
                  (G_meta_table_X,idx,id,(char *)CONCAT44(extraout_var,iVar4),siz_00);
        if ((uVar3 & 2) != 0) {
          *(ushort *)&G_obj_table_X.pages_[id >> 0xc][id & 0xfff].field_0x14 =
               *(ushort *)&G_obj_table_X.pages_[id >> 0xc][id & 0xfff].field_0x14 | 0x80;
        }
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
    return;
  }
LAB_00262bfb:
  err_throw(0x132);
}

Assistant:

void CVmImageLoader::read_data(char *buf, size_t read_len,
                               ulong *remaining_size)
{
    /* ensure we have enough data left in our block */
    if (read_len > *remaining_size)
        err_throw(VMERR_IMAGE_BLOCK_TOO_SMALL);

    /* decrement the remaining size counter for the data we just read */
    *remaining_size -= read_len;

    /* read the data */
    fp_->copy_data(buf, read_len);
}